

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# super_simple_test.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  int *in_stack_00000008;
  bool test_ok;
  _func_void_int_ptr *in_stack_00000010;
  scoped_lock l;
  int i;
  spin_mutex_t *in_stack_ffffffffffffffc8;
  scoped_lock *in_stack_ffffffffffffffd0;
  
  t0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  depspawn::spawn<void(int&),int&>(in_stack_00000010,in_stack_00000008);
  spin_mutex_t::scoped_lock::scoped_lock(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  poVar1 = std::operator<<((ostream *)&std::cerr,"post-spawn");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  spin_mutex_t::scoped_lock::~scoped_lock((scoped_lock *)0x11d853);
  depspawn::wait_for_all();
  poVar1 = std::operator<<((ostream *)&std::cout,"Final i=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"TEST ");
  poVar1 = std::operator<<(poVar1,"UNSUCCESSFUL");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 1;
}

Assistant:

int main()
{ int i = 0;

  t0 = std::chrono::high_resolution_clock::now();
  
  spawn(f, i);
  
  LOG("post-spawn");
  
  wait_for_all();

  std::cout << "Final i=" << i << std::endl;

  const bool test_ok = (i == 10);
  
  std::cout << "TEST " << (test_ok ? "SUCCESSFUL" : "UNSUCCESSFUL") << std::endl;
  
  return !test_ok;
}